

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_sub_8_re_pd(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint res;
  uint dst;
  uint src;
  uint ea;
  
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 1;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = address;
  uVar1 = m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 0xff;
  uVar2 = m68ki_read_8_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_cpu.x_flag = uVar2 - uVar1;
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.v_flag = (uVar1 ^ uVar2) & (m68ki_cpu.x_flag ^ uVar2);
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_sub_8_re_pd(void)
{
	uint ea = EA_AY_PD_8();
	uint src = MASK_OUT_ABOVE_8(DX);
	uint dst = m68ki_read_8(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);

	m68ki_write_8(ea, FLAG_Z);
}